

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopNest
          (LoopUtils *this,Loop *new_loop,LoopCloningResult *cloning_result)

{
  Loop **__k;
  NodePtr old_loop;
  mapped_type *ppLVar1;
  Loop *pLVar2;
  Loop *sub_loop;
  Loop *this_00;
  LoopUtils *this_01;
  unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
  loop_mapping;
  TreeDFIterator<spvtools::opt::Loop> __begin2;
  TreeDFIterator<spvtools::opt::Loop> __end2;
  Loop *local_1e0;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_1d8;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> local_1d0;
  undefined1 local_1c8 [56];
  TreeDFIterator<spvtools::opt::Loop> local_190;
  TreeDFIterator<spvtools::opt::Loop> local_138;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> local_e0;
  
  local_1c8._0_8_ = local_1c8 + 0x30;
  local_1c8._8_8_ = (LoopDescriptor *)0x1;
  local_1c8._16_8_ = (Loop *)0x0;
  local_1c8._24_8_ = (Function *)0x0;
  local_1c8._32_4_ = 1.0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = (__node_base_ptr)0x0;
  __k = &this->loop_;
  ppLVar1 = std::__detail::
            _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)local_1c8,__k);
  *ppLVar1 = new_loop;
  pLVar2 = this->loop_;
  this_00 = pLVar2->parent_;
  if (this_00 != (Loop *)0x0) {
    Loop::AddNestedLoop(this_00,new_loop);
    pLVar2 = *__k;
  }
  local_1d8._M_head_impl = new_loop;
  PopulateLoopDesc((LoopUtils *)this_00,new_loop,pLVar2,cloning_result);
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_190,*__k);
  TreeDFIterator<spvtools::opt::Loop>::MoveToNextNode(&local_190);
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_138);
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::IteratorRange
            (&local_e0,&local_190,&local_138);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_138.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_190.parent_iterators_);
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_190,&local_e0.begin_);
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_138,&local_e0.end_);
  while (old_loop = local_190.current_, local_190.current_ != local_138.current_) {
    pLVar2 = (Loop *)::operator_new(0x90);
    pLVar2->context_ = this->context_;
    (pLVar2->nested_loops_).
    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar2->nested_loops_).
    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar2->loop_latch_ = (BasicBlock *)0x0;
    pLVar2->parent_ = (Loop *)0x0;
    pLVar2->loop_merge_ = (BasicBlock *)0x0;
    pLVar2->loop_preheader_ = (BasicBlock *)0x0;
    pLVar2->loop_header_ = (BasicBlock *)0x0;
    pLVar2->loop_continue_ = (BasicBlock *)0x0;
    (pLVar2->nested_loops_).
    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pLVar2->loop_basic_blocks_)._M_h._M_buckets =
         &(pLVar2->loop_basic_blocks_)._M_h._M_single_bucket;
    (pLVar2->loop_basic_blocks_)._M_h._M_bucket_count = 1;
    (pLVar2->loop_basic_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pLVar2->loop_basic_blocks_)._M_h._M_element_count = 0;
    (pLVar2->loop_basic_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pLVar2->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
    (pLVar2->loop_basic_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pLVar2->loop_is_marked_for_removal_ = false;
    local_1e0 = old_loop->parent_;
    ppLVar1 = std::__detail::
              _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_1c8,&local_1e0);
    if (*ppLVar1 != (Loop *)0x0) {
      Loop::AddNestedLoop(*ppLVar1,pLVar2);
    }
    local_1e0 = old_loop;
    this_01 = (LoopUtils *)local_1c8;
    ppLVar1 = std::__detail::
              _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_1c8,&local_1e0);
    *ppLVar1 = pLVar2;
    PopulateLoopDesc(this_01,pLVar2,old_loop,cloning_result);
    TreeDFIterator<spvtools::opt::Loop>::MoveToNextNode(&local_190);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_138.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_190.parent_iterators_);
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::~IteratorRange(&local_e0);
  local_1d0._M_t.
  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
  super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>)
       (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>)
       local_1d8._M_head_impl;
  LoopDescriptor::AddLoopNest(this->loop_desc_,&local_1d0);
  std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
            (&local_1d0);
  std::
  _Hashtable<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1c8);
  return;
}

Assistant:

void LoopUtils::PopulateLoopNest(
    Loop* new_loop, const LoopCloningResult& cloning_result) const {
  std::unordered_map<Loop*, Loop*> loop_mapping;
  loop_mapping[loop_] = new_loop;

  if (loop_->HasParent()) loop_->GetParent()->AddNestedLoop(new_loop);
  PopulateLoopDesc(new_loop, loop_, cloning_result);

  for (Loop& sub_loop :
       make_range(++TreeDFIterator<Loop>(loop_), TreeDFIterator<Loop>())) {
    Loop* cloned = new Loop(context_);
    if (Loop* parent = loop_mapping[sub_loop.GetParent()])
      parent->AddNestedLoop(cloned);
    loop_mapping[&sub_loop] = cloned;
    PopulateLoopDesc(cloned, &sub_loop, cloning_result);
  }

  loop_desc_->AddLoopNest(std::unique_ptr<Loop>(new_loop));
}